

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void * nk_create_panel(nk_context *ctx)

{
  nk_page_element *ptr;
  
  ptr = nk_create_page_element(ctx);
  if (ptr != (nk_page_element *)0x0) {
    nk_zero(ptr,0x1c8);
  }
  return ptr;
}

Assistant:

NK_INTERN void*
nk_create_panel(struct nk_context *ctx)
{
    struct nk_page_element *elem;
    elem = nk_create_page_element(ctx);
    if (!elem) return 0;
    nk_zero_struct(*elem);
    return &elem->data.pan;
}